

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDiscardTests.cpp
# Opt level: O0

char * vkt::sr::anon_unknown_0::getModeName(DiscardMode mode)

{
  char *pcStack_10;
  DiscardMode mode_local;
  
  switch(mode) {
  case DISCARDMODE_ALWAYS:
    pcStack_10 = "always";
    break;
  case DISCARDMODE_NEVER:
    pcStack_10 = "never";
    break;
  case DISCARDMODE_UNIFORM:
    pcStack_10 = "uniform";
    break;
  case DISCARDMODE_DYNAMIC:
    pcStack_10 = "dynamic";
    break;
  case DISCARDMODE_TEXTURE:
    pcStack_10 = "texture";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* getModeName (DiscardMode mode)
{
	switch (mode)
	{
		case DISCARDMODE_ALWAYS:	return "always";
		case DISCARDMODE_NEVER:		return "never";
		case DISCARDMODE_UNIFORM:	return "uniform";
		case DISCARDMODE_DYNAMIC:	return "dynamic";
		case DISCARDMODE_TEXTURE:	return "texture";
		default:
			DE_ASSERT(DE_FALSE);
			return DE_NULL;
	}
}